

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Texture2DArray * __thiscall
tcu::Texture2DArray::operator=(Texture2DArray *this,Texture2DArray *other)

{
  ConstPixelBufferAccess *pCVar1;
  int iVar2;
  
  if (this != other) {
    TextureLevelPyramid::operator=
              (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
    iVar2 = other->m_height;
    this->m_width = other->m_width;
    this->m_height = iVar2;
    this->m_numLayers = other->m_numLayers;
    pCVar1 = &((this->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
    (this->m_view).m_numLevels =
         (int)(((long)(this->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x28);
    (this->m_view).m_levels = pCVar1;
  }
  return this;
}

Assistant:

Texture2DArray& Texture2DArray::operator= (const Texture2DArray& other)
{
	if (this == &other)
		return *this;

	TextureLevelPyramid::operator=(other);

	m_width		= other.m_width;
	m_height	= other.m_height;
	m_numLayers	= other.m_numLayers;
	m_view		= Texture2DArrayView(getNumLevels(), getLevels());

	return *this;
}